

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

void __thiscall
brynet::net::ConnectorWorkInfo::processConnect(ConnectorWorkInfo *this,AsyncConnectAddr *addr)

{
  ushort uVar1;
  sock fd;
  int iVar2;
  int *piVar3;
  mapped_type *pmVar4;
  sockaddr_in server_addr;
  sock local_94;
  undefined1 local_90 [10];
  ushort local_86;
  undefined1 local_84 [12];
  rep local_78;
  rep rStack_70;
  _Any_data _Stack_68;
  code *pcStack_58;
  undefined8 local_50;
  _Any_data _Stack_48;
  code *pcStack_38;
  undefined8 local_30;
  
  base::InitSocket();
  fd = base::SocketCreate(2,1,0);
  local_94 = fd;
  if (fd != -1) {
    base::SocketNonblock(fd);
    local_90._8_2_ = 2;
    inet_pton(2,(addr->mIP)._M_dataplus._M_p,local_84);
    uVar1 = (ushort)addr->mPort;
    local_86 = uVar1 << 8 | uVar1 >> 8;
    iVar2 = connect(fd,(sockaddr *)(local_90 + 8),0x10);
    if (iVar2 == 0) {
      if ((addr->mSuccessCB).super__Function_base._M_manager == (_Manager_type)0x0) {
        return;
      }
      TcpSocket::Create((TcpSocket *)local_90,fd,false);
      if ((addr->mSuccessCB).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(addr->mSuccessCB)._M_invoker)
                  ((_Any_data *)&addr->mSuccessCB,
                   (unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter> *)
                   local_90);
        if ((tuple<brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>)
            local_90._0_8_ == (_Head_base<0UL,_brynet::net::TcpSocket_*,_false>)0x0) {
          return;
        }
        (**(code **)(*(_func_int **)local_90._0_8_ + 8))();
        return;
      }
      std::__throw_bad_function_call();
    }
    piVar3 = __errno_location();
    if (*piVar3 == 0x73) {
      _Stack_48._8_8_ = 0;
      pcStack_38 = (code *)0x0;
      local_50 = 0;
      _Stack_48._M_unused._M_object = (void *)0x0;
      _Stack_68._8_8_ = 0;
      pcStack_58 = (code *)0x0;
      rStack_70 = 0;
      _Stack_68._M_unused._M_object = (void *)0x0;
      local_30 = 0;
      local_78 = std::chrono::_V2::steady_clock::now();
      std::
      function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
      ::operator=((function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
                   *)&_Stack_68,&addr->mSuccessCB);
      std::function<void_()>::operator=((function<void_()> *)&_Stack_48,&addr->mFailedCB);
      rStack_70 = (addr->mTimeout).__r;
      pmVar4 = std::
               map<int,_brynet::net::ConnectorWorkInfo::ConnectingInfo,_std::less<int>,_std::allocator<std::pair<const_int,_brynet::net::ConnectorWorkInfo::ConnectingInfo>_>_>
               ::operator[](&this->mConnectingInfos,&local_94);
      (pmVar4->startConnectTime).__d.__r = local_78;
      (pmVar4->timeout).__r = rStack_70;
      std::
      function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
      ::operator=(&pmVar4->successCB,
                  (function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
                   *)&_Stack_68);
      std::function<void_()>::operator=(&pmVar4->failedCB,(function<void_()> *)&_Stack_48);
      ox_fdset_add((this->mFDSet)._M_t.
                   super___uniq_ptr_impl<fdset_s,_brynet::net::ConnectorWorkInfo::FDSetDeleter>._M_t
                   .super__Tuple_impl<0UL,_fdset_s_*,_brynet::net::ConnectorWorkInfo::FDSetDeleter>.
                   super__Head_base<0UL,_fdset_s_*,_false>._M_head_impl,local_94,2);
      if (pcStack_38 != (code *)0x0) {
        (*pcStack_38)(&_Stack_48,&_Stack_48,__destroy_functor);
      }
      if (pcStack_58 == (code *)0x0) {
        return;
      }
      (*pcStack_58)(&_Stack_68,&_Stack_68,__destroy_functor);
      return;
    }
    base::SocketClose(fd);
  }
  if ((addr->mFailedCB).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(addr->mFailedCB)._M_invoker)((_Any_data *)&addr->mFailedCB);
  }
  return;
}

Assistant:

void ConnectorWorkInfo::processConnect(const AsyncConnectAddr& addr)
{
    struct sockaddr_in server_addr;
    sock clientfd = SOCKET_ERROR;

#if defined PLATFORM_WINDOWS
    int check_error = WSAEWOULDBLOCK;
#else
    int check_error = EINPROGRESS;
#endif
    int n = 0;

    brynet::net::base::InitSocket();

    clientfd = brynet::net::base::SocketCreate(AF_INET, SOCK_STREAM, 0);
    if (clientfd == SOCKET_ERROR)
    {
        goto FAILED;
    }

    brynet::net::base::SocketNonblock(clientfd);
    server_addr.sin_family = AF_INET;
    inet_pton(AF_INET, addr.getIP().c_str(), &server_addr.sin_addr.s_addr);
    server_addr.sin_port = htons(addr.getPort());

    n = connect(clientfd, (struct sockaddr*)&server_addr, sizeof(struct sockaddr));
    if (n == 0)
    {
        goto SUCCESS;
    }

    if (check_error != sErrno)
    {
        brynet::net::base::SocketClose(clientfd);
        clientfd = SOCKET_ERROR;
        goto FAILED;
    }

    {
        ConnectingInfo ci;
        ci.startConnectTime = std::chrono::steady_clock::now();
        ci.successCB = addr.getSuccessCB();
        ci.failedCB = addr.getFailedCB();
        ci.timeout = addr.getTimeout();

        mConnectingInfos[clientfd] = ci;
        ox_fdset_add(mFDSet.get(), clientfd, WriteCheck);
    }
    return;

SUCCESS:
    if (addr.getSuccessCB() != nullptr)
    {
        addr.getSuccessCB()(TcpSocket::Create(clientfd, false));
    }
    return;

FAILED:
    if (addr.getFailedCB() != nullptr)
    {
        addr.getFailedCB()();
    }
}